

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNlaProductForm.cpp
# Opt level: O3

HighsInt __thiscall
ProductFormUpdate::update(ProductFormUpdate *this,HVector *aq,HighsInt *pivot_row)

{
  iterator iVar1;
  iterator iVar2;
  HighsInt HVar3;
  double *__args;
  long lVar4;
  double dVar5;
  HighsInt iRow;
  double pivot;
  int local_54;
  double local_50;
  double local_48;
  undefined8 uStack_40;
  
  HVar3 = 1;
  if (this->update_count_ < 0x32) {
    local_50 = (aq->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[*pivot_row];
    HVar3 = 7;
    if (1e-08 <= ABS(local_50)) {
      iVar1._M_current =
           (this->pivot_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (this->pivot_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        uStack_40 = 0;
        local_48 = local_50;
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->pivot_index_,iVar1,pivot_row);
        dVar5 = local_48;
      }
      else {
        *iVar1._M_current = *pivot_row;
        (this->pivot_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        dVar5 = local_50;
      }
      iVar2._M_current =
           (this->pivot_value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->pivot_value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&this->pivot_value_,iVar2,&local_50);
      }
      else {
        *iVar2._M_current = dVar5;
        (this->pivot_value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      if (0 < aq->count) {
        lVar4 = 0;
        do {
          local_54 = (aq->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar4];
          if (local_54 != *pivot_row) {
            iVar1._M_current =
                 (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar1._M_current ==
                (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&this->index_,iVar1,&local_54);
            }
            else {
              *iVar1._M_current = local_54;
              (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar1._M_current + 1;
            }
            __args = (aq->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start + local_54;
            iVar2._M_current =
                 (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        ((vector<double,std::allocator<double>> *)&this->value_,iVar2,__args);
            }
            else {
              *iVar2._M_current = *__args;
              (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar2._M_current + 1;
            }
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 < aq->count);
      }
      local_54 = (int)((ulong)((long)(this->index_).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->index_).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2);
      iVar1._M_current =
           (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&this->start_,iVar1,&local_54);
      }
      else {
        *iVar1._M_current = local_54;
        (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_finish = iVar1._M_current + 1;
      }
      this->update_count_ = this->update_count_ + 1;
      HVar3 = 0;
    }
  }
  return HVar3;
}

Assistant:

HighsInt ProductFormUpdate::update(HVector* aq, HighsInt* pivot_row) {
  assert(0 <= *pivot_row && *pivot_row < num_row_);
  if (update_count_ >= kProductFormMaxUpdates)
    return kRebuildReasonUpdateLimitReached;
  double pivot = aq->array[*pivot_row];
  if (fabs(pivot) < kProductFormPivotTolerance)
    return kRebuildReasonPossiblySingularBasis;
  pivot_index_.push_back(*pivot_row);
  pivot_value_.push_back(pivot);
  for (HighsInt iX = 0; iX < aq->count; iX++) {
    HighsInt iRow = aq->index[iX];
    if (iRow == *pivot_row) continue;
    index_.push_back(iRow);
    value_.push_back(aq->array[iRow]);
  }
  start_.push_back(index_.size());
  update_count_++;
  return kRebuildReasonNo;
}